

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O3

void Amap_LibPrintSelectedGates(Amap_Lib_t *p,int fAllGates)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  ulong uVar3;
  
  pVVar1 = (&p->vGates)[(ulong)(fAllGates == 0) * 2];
  if (0 < pVVar1->nSize) {
    uVar3 = 0;
    do {
      pvVar2 = pVVar1->pArray[uVar3];
      printf("%3d :%12s %d %9.2f  ",*(undefined8 *)((long)pvVar2 + 0x20),uVar3 & 0xffffffff,
             *(undefined8 *)((long)pvVar2 + 0x10),(ulong)*(byte *)((long)pvVar2 + 0x3b));
      printf("%4s=%40s  ",*(undefined8 *)((long)pvVar2 + 0x18),*(undefined8 *)((long)pvVar2 + 0x28))
      ;
      printf("DSD: ");
      Kit_DsdPrintFromTruth(*(uint **)((long)pvVar2 + 0x30),(uint)*(byte *)((long)pvVar2 + 0x3b));
      putchar(10);
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)pVVar1->nSize);
  }
  return;
}

Assistant:

void Amap_LibPrintSelectedGates( Amap_Lib_t * p, int fAllGates )
{
    Vec_Ptr_t * vArray;
    Amap_Gat_t * pGate;
    int i;
    vArray = fAllGates? p->vGates : p->vSelect;
    Vec_PtrForEachEntry( Amap_Gat_t *, vArray, pGate, i )
    {
        printf( "%3d :%12s %d %9.2f  ", i, pGate->pName, pGate->nPins, pGate->dArea );
        printf( "%4s=%40s  ", pGate->pOutName, pGate->pForm );
        printf( "DSD: " );
        Kit_DsdPrintFromTruth( pGate->pFunc, pGate->nPins );
        printf( "\n" );
    }
}